

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O2

bool TestLowbitsCollisions<Blob<224>>(vector<Blob<224>,_std::allocator<Blob<224>_>_> *revhashes)

{
  uint nbHBits;
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  int b;
  int in_ESI;
  uint uVar4;
  bool bVar5;
  int nbHashes;
  double in_XMM0_Qa;
  double dVar6;
  uint local_44;
  double local_40;
  double local_38;
  
  uVar3 = 0;
  nbHashes = (int)(((long)(revhashes->super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(revhashes->super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>).
                         _M_impl.super__Vector_impl_data._M_start) / 0x1c);
  nbHBits = FindMinBits_TargetCollisionShare(nbHashes,in_XMM0_Qa);
  uVar1 = FindMaxBits_TargetCollisionNb(nbHashes,in_ESI);
  bVar5 = true;
  if (0xffffff20 < uVar1 - 0xe0) {
    local_44 = 0;
    printf("Testing collisions (low  %2i-%2i bits) - ",(ulong)nbHBits,(ulong)uVar1);
    uVar4 = 0;
    local_40 = 0.0;
    local_38 = 1.0;
    for (; (int)nbHBits <= (int)uVar1; nbHBits = nbHBits + 1) {
      uVar2 = CountNbCollisions<Blob<224>>(revhashes,nbHBits);
      dVar6 = EstimateNbCollisions(nbHashes,nbHBits);
      if (local_40 < (double)(int)uVar2 / dVar6) {
        uVar4 = uVar2;
        local_44 = nbHBits;
        local_40 = (double)(int)uVar2 / dVar6;
        local_38 = dVar6;
      }
    }
    bVar5 = true;
    printf("Worst is %2i bits: %2i/%2i (%.2fx)",local_40,(ulong)local_44,(ulong)uVar4,
           CONCAT44((int)((ulong)uVar3 >> 0x20),(int)local_38));
    if (2.0 < local_40) {
      puts(" !!!!!");
      bVar5 = false;
    }
    else {
      putchar(10);
    }
  }
  return bVar5;
}

Assistant:

bool TestLowbitsCollisions ( std::vector<hashtype> & revhashes)
{
  int origBits = sizeof(hashtype) * 8;

  size_t const nbH = revhashes.size();
  int const minBits = FindMinBits_TargetCollisionShare(nbH, 0.01);
  int const maxBits = FindMaxBits_TargetCollisionNb(nbH, 20);
  if (maxBits <= 0 || maxBits >= origBits) return true;

  printf("Testing collisions (low  %2i-%2i bits) - ", minBits, maxBits);
  double maxCollDev = 0.0;
  int maxCollDevBits = 0;
  int maxCollDevNb = 0;
  double maxCollDevExp = 1.0;

  for (int b = minBits; b <= maxBits; b++) {
      int    const nbColls = CountNbCollisions(revhashes, b);
      double const expected = EstimateNbCollisions(nbH, b);
      assert(expected > 0.0);
      double const dev = (double)nbColls / expected;
      if (dev > maxCollDev) {
          maxCollDev = dev;
          maxCollDevBits = b;
          maxCollDevNb = nbColls;
          maxCollDevExp = expected;
      }
  }

  printf("Worst is %2i bits: %2i/%2i (%.2fx)",
        maxCollDevBits, maxCollDevNb, (int)maxCollDevExp, maxCollDev);

  if (maxCollDev > 2.0) {
    printf(" !!!!!\n");
    return false;
  }

  printf("\n");
  return true;
}